

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O0

void __thiscall
FIXT11::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  string *__lhs;
  string *msgTypeValue;
  SessionID *sessionID_local;
  Message *message_local;
  MessageCracker *this_local;
  
  this_00 = Message::getHeader(message);
  __lhs = FIX::FieldMap::getField_abi_cxx11_((FieldMap *)this_00,0x23);
  bVar1 = std::operator==(__lhs,"0");
  if (bVar1) {
    (*this->_vptr_MessageCracker[4])(this,message,sessionID);
  }
  else {
    bVar1 = std::operator==(__lhs,"1");
    if (bVar1) {
      (*this->_vptr_MessageCracker[5])(this,message,sessionID);
    }
    else {
      bVar1 = std::operator==(__lhs,"2");
      if (bVar1) {
        (*this->_vptr_MessageCracker[6])(this,message,sessionID);
      }
      else {
        bVar1 = std::operator==(__lhs,"3");
        if (bVar1) {
          (*this->_vptr_MessageCracker[7])(this,message,sessionID);
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            (*this->_vptr_MessageCracker[8])(this,message,sessionID);
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              (*this->_vptr_MessageCracker[9])(this,message,sessionID);
            }
            else {
              bVar1 = std::operator==(__lhs,"A");
              if (bVar1) {
                (*this->_vptr_MessageCracker[10])(this,message,sessionID);
              }
              else {
                (*this->_vptr_MessageCracker[2])(this,message,sessionID);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string& msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    if( msgTypeValue == "0" )
      onMessage( (const Heartbeat&)message, sessionID );
    else
    if( msgTypeValue == "1" )
      onMessage( (const TestRequest&)message, sessionID );
    else
    if( msgTypeValue == "2" )
      onMessage( (const ResendRequest&)message, sessionID );
    else
    if( msgTypeValue == "3" )
      onMessage( (const Reject&)message, sessionID );
    else
    if( msgTypeValue == "4" )
      onMessage( (const SequenceReset&)message, sessionID );
    else
    if( msgTypeValue == "5" )
      onMessage( (const Logout&)message, sessionID );
    else
    if( msgTypeValue == "A" )
      onMessage( (const Logon&)message, sessionID );
    else onMessage( message, sessionID );
  }